

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_asof_join.cpp
# Opt level: O2

bool __thiscall duckdb::AsOfProbeBuffer::NextLeft(AsOfProbeBuffer *this)

{
  bool bVar1;
  pointer this_00;
  pointer pPVar2;
  idx_t entry_idx_p;
  
  bVar1 = HasMoreData(this);
  if (bVar1) {
    DataChunk::Reset(&this->lhs_payload);
    this_00 = unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::
              operator->(&this->left_itr);
    pPVar2 = unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>::
             operator->(&this->lhs_scanner);
    entry_idx_p = PayloadScanner::Scanned(pPVar2);
    SBIterator::SetIndex(this_00,entry_idx_p);
    pPVar2 = unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>::
             operator->(&this->lhs_scanner);
    PayloadScanner::Scan(pPVar2,&this->lhs_payload);
  }
  return bVar1;
}

Assistant:

bool AsOfProbeBuffer::NextLeft() {
	if (!HasMoreData()) {
		return false;
	}

	//	Scan the next sorted chunk
	lhs_payload.Reset();
	left_itr->SetIndex(lhs_scanner->Scanned());
	lhs_scanner->Scan(lhs_payload);

	return true;
}